

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::Phi(float x)

{
  float in_XMM0_Da;
  float fVar1;
  double dVar2;
  undefined4 local_4;
  
  fVar1 = in_XMM0_Da * 0.70710677;
  if (-0.47693625 <= fVar1) {
    if (fVar1 <= 0.47693625) {
      dVar2 = std::erf((double)(ulong)(uint)fVar1);
      local_4 = SUB84(dVar2,0) * 0.5 + 0.5;
    }
    else {
      dVar2 = std::erfc((double)(ulong)(uint)fVar1);
      local_4 = SUB84(dVar2,0) * -0.5 + 1.0;
    }
  }
  else {
    dVar2 = std::erfc((double)(ulong)(uint)-fVar1);
    local_4 = SUB84(dVar2,0) * 0.5;
  }
  return local_4;
}

Assistant:

TRNG_CUDA_ENABLE
    inline float Phi(float x) {
      x *= constants<float>::one_over_sqrt_2;
      if (x < -0.6744897501960817f * constants<float>::one_over_sqrt_2)
        return 0.5f * erfc(-x);
      if (x > +0.6744897501960817f * constants<float>::one_over_sqrt_2)
        return 1.0f - 0.5f * erfc(x);
      return 0.5f + 0.5f * erf(x);
    }